

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbisfile.c
# Opt level: O0

int ov_crosslap(OggVorbis_File *vf1,OggVorbis_File *vf2)

{
  int ch2;
  long lVar1;
  vorbis_info *pvVar2;
  int n2_00;
  int n1_00;
  float *pfVar3;
  float **ppfVar4;
  OggVorbis_File *vf;
  int iVar5;
  float **ppfVar6;
  vorbis_dsp_state *pvVar7;
  float *apfStack_80 [2];
  int local_6c;
  int local_68;
  int local_64;
  int hs2;
  int hs1;
  int ret;
  int i;
  int n2;
  int n1;
  float *w2;
  float *w1;
  float **pcm;
  float **lappcm;
  vorbis_info *vi2;
  vorbis_info *vi1;
  OggVorbis_File *vf2_local;
  OggVorbis_File *vf1_local;
  
  if (vf1 == vf2) {
    vf1_local._4_4_ = 0;
  }
  else if (vf1->ready_state < 2) {
    vf1_local._4_4_ = -0x83;
  }
  else if (vf2->ready_state < 2) {
    vf1_local._4_4_ = -0x83;
  }
  else {
    apfStack_80[0] = (float *)0x252981;
    vi1 = (vorbis_info *)vf2;
    vf2_local = vf1;
    hs2 = _ov_initset(vf1);
    vf1_local._4_4_ = hs2;
    if (hs2 == 0) {
      apfStack_80[0] = (float *)0x25299e;
      hs2 = _ov_initprime((OggVorbis_File *)vi1);
      vf1_local._4_4_ = hs2;
      if (hs2 == 0) {
        local_6c = -1;
        apfStack_80[0] = (float *)0x2529c3;
        vi2 = ov_info(vf2_local,-1);
        apfStack_80[0] = (float *)0x2529d3;
        lappcm = (float **)ov_info((OggVorbis_File *)vi1,local_6c);
        apfStack_80[0] = (float *)0x2529e0;
        local_64 = ov_halfrate_p(vf2_local);
        apfStack_80[0] = (float *)0x2529ec;
        local_68 = ov_halfrate_p((OggVorbis_File *)vi1);
        pvVar2 = vi2;
        lVar1 = -((long)vi2->channels * 8 + 0xfU & 0xfffffffffffffff0);
        ppfVar6 = (float **)((long)apfStack_80 + lVar1 + 8);
        pcm = ppfVar6;
        *(undefined8 *)((long)apfStack_80 + lVar1) = 0x252a1b;
        iVar5 = vorbis_info_blocksize(pvVar2,0);
        ppfVar4 = lappcm;
        i = iVar5 >> ((char)local_64 + 1U & 0x1f);
        *(undefined8 *)((long)apfStack_80 + lVar1) = 0x252a31;
        iVar5 = vorbis_info_blocksize((vorbis_info *)ppfVar4,0);
        ret = iVar5 >> ((char)local_68 + 1U & 0x1f);
        pvVar7 = &vf2_local->vd;
        *(undefined8 *)((long)apfStack_80 + lVar1) = 0x252a4e;
        w2 = vorbis_window(pvVar7,0);
        pvVar2 = vi1 + 10;
        *(undefined8 *)((long)apfStack_80 + lVar1) = 0x252a64;
        _n2 = vorbis_window((vorbis_dsp_state *)&pvVar2->bitrate_upper,0);
        vf = vf2_local;
        pvVar2 = vi2;
        ppfVar4 = pcm;
        iVar5 = i;
        for (hs1 = 0; hs1 < vi2->channels; hs1 = hs1 + 1) {
          ppfVar6 = (float **)((long)ppfVar6 - ((long)i * 4 + 0xfU & 0xfffffffffffffff0));
          pcm[hs1] = (float *)ppfVar6;
        }
        pvVar7 = &vf2_local->vd;
        ppfVar6[-1] = (float *)0x252acb;
        _ov_getlap(vf,pvVar2,pvVar7,ppfVar4,iVar5);
        pvVar2 = vi1 + 10;
        ppfVar6[-1] = (float *)0x252adf;
        vorbis_synthesis_lapout((vorbis_dsp_state *)&pvVar2->bitrate_upper,(float ***)&w1);
        ppfVar4 = pcm;
        pfVar3 = _n2;
        n1_00 = i;
        n2_00 = ret;
        iVar5 = vi2->channels;
        ch2 = *(int *)((long)lappcm + 4);
        ppfVar6[-2] = w2;
        ppfVar6[-1] = pfVar3;
        ppfVar6[-3] = (float *)0x252b17;
        _ov_splice((float **)w1,ppfVar4,n1_00,n2_00,iVar5,ch2,ppfVar6[-2],ppfVar6[-1]);
        vf1_local._4_4_ = 0;
      }
    }
  }
  return vf1_local._4_4_;
}

Assistant:

int ov_crosslap(OggVorbis_File *vf1, OggVorbis_File *vf2){
  vorbis_info *vi1,*vi2;
  float **lappcm;
  float **pcm;
  const float *w1,*w2;
  int n1,n2,i,ret,hs1,hs2;

  if(vf1==vf2)return(0); /* degenerate case */
  if(vf1->ready_state<OPENED)return(OV_EINVAL);
  if(vf2->ready_state<OPENED)return(OV_EINVAL);

  /* the relevant overlap buffers must be pre-checked and pre-primed
     before looking at settings in the event that priming would cross
     a bitstream boundary.  So, do it now */

  ret=_ov_initset(vf1);
  if(ret)return(ret);
  ret=_ov_initprime(vf2);
  if(ret)return(ret);

  vi1=ov_info(vf1,-1);
  vi2=ov_info(vf2,-1);
  hs1=ov_halfrate_p(vf1);
  hs2=ov_halfrate_p(vf2);

  lappcm=alloca(sizeof(*lappcm)*vi1->channels);
  n1=vorbis_info_blocksize(vi1,0)>>(1+hs1);
  n2=vorbis_info_blocksize(vi2,0)>>(1+hs2);
  w1=vorbis_window(&vf1->vd,0);
  w2=vorbis_window(&vf2->vd,0);

  for(i=0;i<vi1->channels;i++)
    lappcm[i]=alloca(sizeof(**lappcm)*n1);

  _ov_getlap(vf1,vi1,&vf1->vd,lappcm,n1);

  /* have a lapping buffer from vf1; now to splice it into the lapping
     buffer of vf2 */
  /* consolidate and expose the buffer. */
  vorbis_synthesis_lapout(&vf2->vd,&pcm);

#if 0
  _analysis_output_always("pcmL",0,pcm[0],n1*2,0,0,0);
  _analysis_output_always("pcmR",0,pcm[1],n1*2,0,0,0);
#endif

  /* splice */
  _ov_splice(pcm,lappcm,n1,n2,vi1->channels,vi2->channels,w1,w2);

  /* done */
  return(0);
}